

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O2

vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
* hevc_extract_priv_data
            (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *__return_storage_ptr__,uint8_t *buff,int size,uint8_t *nal_size)

{
  byte bVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint uVar6;
  ushort *puVar7;
  int iVar8;
  ulong uVar9;
  ushort *__x;
  ushort *puVar10;
  uint *local_208;
  undefined8 local_200;
  uint local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream ss;
  
  *nal_size = '\x04';
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0x16 < size) {
    *nal_size = (buff[0x15] & 3) + 1;
    bVar1 = buff[0x16];
    puVar7 = (ushort *)(buff + 0x17);
    puVar10 = (ushort *)(buff + (uint)size);
    for (uVar4 = 0; uVar4 != bVar1; uVar4 = uVar4 + 1) {
      if (puVar10 < (ushort *)((long)puVar7 + 3U)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::operator<<((ostream *)&ss,"Invalid HEVC extra data format");
        puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar5 = 0x3b6;
        *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
        if (local_1c8 == &local_1b8) {
          puVar5[6] = local_1b8;
          puVar5[7] = uStack_1b4;
          puVar5[8] = uStack_1b0;
          puVar5[9] = uStack_1ac;
        }
        else {
          *(uint **)(puVar5 + 2) = local_1c8;
          *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1b4,local_1b8);
        }
        *(undefined8 *)(puVar5 + 4) = local_1c0;
        local_1c0 = 0;
        local_1b8 = local_1b8 & 0xffffff00;
        local_1c8 = &local_1b8;
        __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      uVar2 = AV_RB16((uint8_t *)((long)puVar7 + 1));
      puVar7 = (ushort *)((long)puVar7 + 3U);
      for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
        __x = puVar7 + 1;
        if (puVar10 < __x) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          std::operator<<((ostream *)&ss,"Invalid HEVC extra data format");
          puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar5 = 0x3b6;
          *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
          if (local_1e8 == &local_1d8) {
            puVar5[6] = local_1d8;
            puVar5[7] = uStack_1d4;
            puVar5[8] = uStack_1d0;
            puVar5[9] = uStack_1cc;
          }
          else {
            *(uint **)(puVar5 + 2) = local_1e8;
            *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1d4,local_1d8);
          }
          *(undefined8 *)(puVar5 + 4) = local_1e0;
          local_1e0 = 0;
          local_1d8 = local_1d8 & 0xffffff00;
          local_1e8 = &local_1d8;
          __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        uVar3 = *puVar7 << 8 | *puVar7 >> 8;
        uVar9 = (ulong)uVar3;
        if (puVar10 < (ushort *)((long)__x + uVar9)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          std::operator<<((ostream *)&ss,"Invalid HEVC extra data format");
          puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar5 = 0x3b6;
          *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
          if (local_208 == &local_1f8) {
            puVar5[6] = local_1f8;
            puVar5[7] = uStack_1f4;
            puVar5[8] = uStack_1f0;
            puVar5[9] = uStack_1ec;
          }
          else {
            *(uint **)(puVar5 + 2) = local_208;
            *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1f4,local_1f8);
          }
          *(undefined8 *)(puVar5 + 4) = local_200;
          local_1f8 = local_1f8 & 0xffffff00;
          __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        puVar7 = __x;
        if (uVar3 != 0) {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::emplace_back<>(__return_storage_ptr__);
          while (iVar8 = (int)uVar9, uVar9 = (ulong)(iVar8 - 1), puVar7 = __x, iVar8 != 0) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((__return_storage_ptr__->
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1,(value_type_conflict1 *)__x)
            ;
            __x = (ushort *)((long)__x + 1);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<uint8_t>> hevc_extract_priv_data(const uint8_t* buff, int size, uint8_t* nal_size)
{
    *nal_size = 4;

    vector<vector<uint8_t>> spsPps;
    if (size < 23)
        return spsPps;

    *nal_size = (buff[21] & 3) + 1;
    int num_arrays = buff[22];

    const uint8_t* src = buff + 23;
    const uint8_t* end = buff + size;
    for (int i = 0; i < num_arrays; ++i)
    {
        if (src + 3 > end)
            THROW(ERR_MOV_PARSE, "Invalid HEVC extra data format")
        src++;  // type
        int cnt = AV_RB16(src);
        src += 2;

        for (int j = 0; j < cnt; ++j)
        {
            if (src + 2 > end)
                THROW(ERR_MOV_PARSE, "Invalid HEVC extra data format")
            int nalSize = (src[0] << 8) + src[1];
            src += 2;
            if (src + nalSize > end)
                THROW(ERR_MOV_PARSE, "Invalid HEVC extra data format")
            if (nalSize > 0)
            {
                spsPps.emplace_back();
                for (int k = 0; k < nalSize; ++k, ++src) spsPps.rbegin()->push_back(*src);
            }
        }
    }

    return spsPps;
}